

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

void linsolve_lower(double *L,int N,double *b,double *x)

{
  double *__ptr;
  double *col;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  
  lVar7 = (long)N;
  __ptr = (double *)malloc(lVar7 * 8);
  col = (double *)malloc(lVar7 * 8 * lVar7);
  iVar3 = 0;
  uVar1 = 0;
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
  }
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
      *__ptr = *b / *L;
      pdVar6 = L + lVar7;
      for (lVar4 = 1; lVar4 < lVar7; lVar4 = lVar4 + 1) {
        dVar8 = 0.0;
        for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
          dVar8 = dVar8 + __ptr[lVar5] * pdVar6[lVar5];
        }
        __ptr[lVar4] = (b[lVar4] - dVar8) / L[lVar4 + (int)lVar4 * N];
        pdVar6 = pdVar6 + lVar7;
      }
      mtranspose(L,N,N,col);
      iVar3 = N + -1;
      x[iVar3] = __ptr[iVar3] / col[(ulong)(uint)(N * N) - 1];
      uVar1 = (ulong)(N + -2);
      lVar7 = (long)(N + 1);
      pdVar6 = col + uVar1 * lVar7 + 1;
      for (; -1 < (long)uVar1; uVar1 = uVar1 - 1) {
        dVar8 = 0.0;
        for (lVar4 = 0; iVar3 + (int)lVar4 < N; lVar4 = lVar4 + 1) {
          dVar8 = dVar8 + pdVar6[lVar4] * x[(uVar1 & 0xffffffff) + lVar4 + 1];
        }
        x[uVar1] = (__ptr[uVar1] - dVar8) / col[uVar1 * lVar7];
        iVar3 = iVar3 + -1;
        pdVar6 = pdVar6 + -lVar7;
      }
      free(__ptr);
      free(col);
      return;
    }
    __ptr[uVar2] = 0.0;
    x[uVar2] = 0.0;
    lVar4 = (long)iVar3;
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + N + 1;
  } while ((L[lVar4] != 0.0) || (NAN(L[lVar4])));
  printf("The Matrix system does not have a unique solution");
  exit(1);
}

Assistant:

void linsolve_lower(double *L,int N,double *b,double *x) {
	int i,j,c1,l;
	double *y,*A;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	A = (double*) malloc(sizeof(double) *N *N);
	
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( L[i*N + i] == 0.) {
			printf("The Matrix system does not have a unique solution");
			exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[0]/L[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * L[c1 + j];
		}
		y[i] = (b[i] - sum)/L[c1+i];
	}
	
	mtranspose(L,N,N,A);
	
	//Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
	free(A);
}